

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

uint64_t mpack_node_u64(mpack_node_t node)

{
  mpack_node_data_t *pmVar1;
  
  pmVar1 = node.data;
  if ((node.tree)->error != mpack_ok) {
    return 0;
  }
  if (pmVar1->type == mpack_type_int) {
    if (-1 < (pmVar1->value).i) {
      return (pmVar1->value).i;
    }
  }
  else if (pmVar1->type == mpack_type_uint) {
    return (uint64_t)(pmVar1->value).d;
  }
  mpack_tree_flag_error(node.tree,mpack_error_type);
  return 0;
}

Assistant:

MPACK_INLINE uint64_t mpack_node_u64(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        return node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= 0)
            return (uint64_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}